

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O0

void opj_applyLUT8u_8u32s_C1P3R
               (OPJ_UINT8 *pSrc,OPJ_INT32 srcStride,OPJ_INT32 **pDst,OPJ_INT32 *pDstStride,
               OPJ_UINT8 **pLUT,OPJ_UINT32 width,OPJ_UINT32 height)

{
  byte bVar1;
  OPJ_UINT8 *pOVar2;
  OPJ_UINT8 *pOVar3;
  OPJ_UINT8 *pOVar4;
  uint local_6c;
  OPJ_UINT8 idx;
  OPJ_UINT32 x;
  OPJ_UINT8 *pLUT_B;
  OPJ_UINT8 *pLUT_G;
  OPJ_UINT8 *pLUT_R;
  OPJ_INT32 *pB;
  OPJ_INT32 *pG;
  OPJ_INT32 *pR;
  OPJ_UINT32 y;
  OPJ_UINT32 width_local;
  OPJ_UINT8 **pLUT_local;
  OPJ_INT32 *pDstStride_local;
  OPJ_INT32 **pDst_local;
  OPJ_UINT8 *pOStack_10;
  OPJ_INT32 srcStride_local;
  OPJ_UINT8 *pSrc_local;
  
  pG = *pDst;
  pB = pDst[1];
  pLUT_R = (OPJ_UINT8 *)pDst[2];
  pOVar2 = *pLUT;
  pOVar3 = pLUT[1];
  pOVar4 = pLUT[2];
  pOStack_10 = pSrc;
  for (pR._0_4_ = height; (OPJ_UINT32)pR != 0; pR._0_4_ = (OPJ_UINT32)pR - 1) {
    for (local_6c = 0; local_6c < width; local_6c = local_6c + 1) {
      bVar1 = pOStack_10[local_6c];
      pG[local_6c] = (uint)pOVar2[bVar1];
      pB[local_6c] = (uint)pOVar3[bVar1];
      *(uint *)(pLUT_R + (ulong)local_6c * 4) = (uint)pOVar4[bVar1];
    }
    pOStack_10 = pOStack_10 + srcStride;
    pG = pG + *pDstStride;
    pB = pB + pDstStride[1];
    pLUT_R = pLUT_R + (long)pDstStride[2] * 4;
  }
  return;
}

Assistant:

static void opj_applyLUT8u_8u32s_C1P3R(
    OPJ_UINT8 const* pSrc, OPJ_INT32 srcStride,
    OPJ_INT32* const* pDst, OPJ_INT32 const* pDstStride,
    OPJ_UINT8 const* const* pLUT,
    OPJ_UINT32 width, OPJ_UINT32 height)
{
    OPJ_UINT32 y;
    OPJ_INT32* pR = pDst[0];
    OPJ_INT32* pG = pDst[1];
    OPJ_INT32* pB = pDst[2];
    OPJ_UINT8 const* pLUT_R = pLUT[0];
    OPJ_UINT8 const* pLUT_G = pLUT[1];
    OPJ_UINT8 const* pLUT_B = pLUT[2];

    for (y = height; y != 0U; --y) {
        OPJ_UINT32 x;

        for (x = 0; x < width; x++) {
            OPJ_UINT8 idx = pSrc[x];
            pR[x] = (OPJ_INT32)pLUT_R[idx];
            pG[x] = (OPJ_INT32)pLUT_G[idx];
            pB[x] = (OPJ_INT32)pLUT_B[idx];
        }
        pSrc += srcStride;
        pR += pDstStride[0];
        pG += pDstStride[1];
        pB += pDstStride[2];
    }
}